

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_traits.h
# Opt level: O0

void lzham::helpers::construct_array<lzham::symbol_codec::output_symbol>(output_symbol *p,uint n)

{
  output_symbol *q;
  uint n_local;
  output_symbol *p_local;
  
  for (p_local = p; p_local != p + n; p_local = p_local + 1) {
  }
  return;
}

Assistant:

inline void construct_array(T* p, uint n)
      {
         if (LZHAM_IS_SCALAR_TYPE(T))
         {
            memset(p, 0, sizeof(T) * n);
         }
         else
         {
            T* q = p + n;
            for ( ; p != q; ++p)
               new (static_cast<void*>(p)) T;
         }
      }